

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

_Bool finalize_multisig(wally_psbt_input *input,uchar *out_script,size_t out_script_len,
                       _Bool is_witness,_Bool is_p2sh)

{
  _Bool _Var1;
  int iVar2;
  size_t local_4a0;
  size_t script_len;
  uchar *script;
  size_t max_len;
  size_t sig_index;
  wally_map_item *found_sig;
  uchar *found_pubkey;
  size_t found_pubkey_len;
  size_t opcode_size;
  ulong uStack_458;
  _Bool ret;
  size_t i;
  size_t n_found;
  size_t n_pubkeys;
  size_t threshold;
  uchar *end;
  uchar *p;
  uint32_t sighashes [15];
  uchar sigs [960];
  _Bool is_p2sh_local;
  _Bool is_witness_local;
  size_t out_script_len_local;
  uchar *out_script_local;
  wally_psbt_input *input_local;
  
  threshold = (size_t)(out_script + out_script_len);
  i = 0;
  opcode_size._7_1_ = 0;
  end = out_script;
  _Var1 = script_is_op_n(*out_script,false,&n_pubkeys);
  if ((((_Var1) && (n_pubkeys <= (input->signatures).num_items)) &&
      (_Var1 = script_is_op_n(out_script[out_script_len - 2],false,&n_found), _Var1)) &&
     (n_found < 0x10)) {
    end = end + 1;
    for (uStack_458 = 0; uStack_458 < n_found && end < threshold; uStack_458 = uStack_458 + 1) {
      iVar2 = script_get_push_size_from_bytes(end,threshold - (long)end,(size_t *)&found_pubkey);
      if ((iVar2 != 0) ||
         (iVar2 = script_get_push_opcode_size_from_bytes
                            (end,threshold - (long)end,&found_pubkey_len), iVar2 != 0))
      goto LAB_0010a3ae;
      found_sig = (wally_map_item *)(end + found_pubkey_len);
      end = found_pubkey + (long)found_sig;
      iVar2 = wally_map_find(&input->signatures,(uchar *)found_sig,(size_t)found_pubkey,&max_len);
      if ((iVar2 == 0) && (max_len != 0)) {
        sig_index = (size_t)((input->signatures).items + (max_len - 1));
        sighashes[i - 2] =
             (uint)((wally_map_item *)sig_index)->value
                   [((wally_map_item *)sig_index)->value_len - 1];
        iVar2 = wally_ec_sig_from_der
                          (((wally_map_item *)sig_index)->value,
                           ((wally_map_item *)sig_index)->value_len - 1,
                           (uchar *)(sighashes + i * 0x10 + 0xe),0x40);
        if ((iVar2 == 0) && (i = i + 1, i == n_pubkeys)) break;
      }
    }
    if (i == n_pubkeys) {
      if (is_witness) {
        iVar2 = wally_witness_multisig_from_bytes
                          (out_script,out_script_len,(uchar *)(sighashes + 0xe),i << 6,
                           (uint32_t *)&p,i,0,&input->final_witness);
        if ((iVar2 != 0) || ((is_p2sh && (_Var1 = finalize_p2sh_wrapped(input), !_Var1))))
        goto LAB_0010a3ae;
      }
      else {
        script = (uchar *)(i * 0x4a + out_script_len);
        script_len = (size_t)wally_malloc((size_t)script);
        if (((uchar *)script_len == (uchar *)0x0) ||
           (iVar2 = wally_scriptsig_multisig_from_bytes
                              (out_script,out_script_len,(uchar *)(sighashes + 0xe),i << 6,
                               (uint32_t *)&p,i,0,(uchar *)script_len,(size_t)script,&local_4a0),
           iVar2 != 0)) {
          wally_free((void *)script_len);
          goto LAB_0010a3ae;
        }
        input->final_scriptsig = (uchar *)script_len;
        input->final_scriptsig_len = local_4a0;
      }
      opcode_size._7_1_ = 1;
    }
  }
LAB_0010a3ae:
  wally_clear_2(sighashes + 0xe,0x3c0,&p,0x3c);
  return (_Bool)(opcode_size._7_1_ & 1);
}

Assistant:

static bool finalize_multisig(struct wally_psbt_input *input,
                              const unsigned char *out_script, size_t out_script_len,
                              bool is_witness, bool is_p2sh)
{
    unsigned char sigs[EC_SIGNATURE_LEN * 15];
    uint32_t sighashes[15];
    const unsigned char *p = out_script, *end = p + out_script_len;
    size_t threshold, n_pubkeys, n_found = 0, i;
    bool ret = false;

    if (!script_is_op_n(out_script[0], false, &threshold) ||
        input->signatures.num_items < threshold ||
        !script_is_op_n(out_script[out_script_len - 2], false, &n_pubkeys) ||
        n_pubkeys > 15)
        goto fail; /* Failed to parse or invalid script */

    ++p; /* Skip the threshold */

    /* Collect signatures corresponding to pubkeys in the multisig script */
    for (i = 0; i < n_pubkeys && p < end; ++i) {
        size_t opcode_size, found_pubkey_len;
        const unsigned char *found_pubkey;
        const struct wally_map_item *found_sig;
        size_t sig_index;

        if (script_get_push_size_from_bytes(p, end - p,
                                            &found_pubkey_len) != WALLY_OK ||
            script_get_push_opcode_size_from_bytes(p, end - p,
                                                   &opcode_size) != WALLY_OK)
            goto fail; /* Script is malformed, bail */

        p += opcode_size;
        found_pubkey = p;
        p += found_pubkey_len; /* Move to next pubkey push */

        /* Find the associated signature for this pubkey */
        if (wally_map_find(&input->signatures,
                           found_pubkey, found_pubkey_len,
                           &sig_index) != WALLY_OK || !sig_index)
            continue; /* Not found: try the next pubkey in the script */

        found_sig = &input->signatures.items[sig_index - 1];

        /* Sighash is appended to the DER signature */
        sighashes[n_found] = found_sig->value[found_sig->value_len - 1];
        /* Convert the DER signature to compact form */
        if (wally_ec_sig_from_der(found_sig->value, found_sig->value_len - 1,
                                  sigs + n_found * EC_SIGNATURE_LEN,
                                  EC_SIGNATURE_LEN) != WALLY_OK)
            continue; /* Failed to parse, try next pubkey */

        if (++n_found == threshold)
            break; /* We have enough signatures, ignore any more */
    }

    if (n_found != threshold)
        goto fail; /* Failed to find enough signatures */

    if (is_witness) {
        if (wally_witness_multisig_from_bytes(out_script, out_script_len,
                                              sigs, n_found * EC_SIGNATURE_LEN,
                                              sighashes, n_found,
                                              0, &input->final_witness) != WALLY_OK)
            goto fail;

        if (is_p2sh && !finalize_p2sh_wrapped(input))
            goto fail;
    } else {
        size_t max_len = n_found * (EC_SIGNATURE_DER_MAX_LEN + 2) + out_script_len;
        unsigned char *script = wally_malloc(max_len);
        size_t script_len;

        if (!script ||
            wally_scriptsig_multisig_from_bytes(out_script, out_script_len,
                                                sigs, n_found * EC_SIGNATURE_LEN,
                                                sighashes, n_found, 0,
                                                script, max_len,
                                                &script_len) != WALLY_OK) {
            wally_free(script);
            goto fail;
        }
        input->final_scriptsig = script;
        input->final_scriptsig_len = script_len;
    }
    ret = true;
fail:
    wally_clear_2(sigs, sizeof(sigs), sighashes, sizeof(sighashes));
    return ret;
}